

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

string * nlohmann::detail::exception::name(string *__return_storage_ptr__,string *ename,int id_)

{
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  string *psStack_18;
  int id__local;
  string *ename_local;
  
  local_1c = id_;
  psStack_18 = ename;
  ename_local = __return_storage_ptr__;
  std::operator+(&local_80,"[json.exception.",ename);
  std::operator+(&local_60,&local_80,".");
  std::__cxx11::to_string(&local_b0,local_1c);
  std::operator+(&local_40,&local_60,&local_b0);
  std::operator+(__return_storage_ptr__,&local_40,"] ");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

static std::string name(const std::string& ename, int id_) {
		return "[json.exception." + ename + "." + std::to_string(id_) + "] ";
	}